

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O0

iterator __thiscall
GF2::MI<45UL,_GF2::MOGrlex<45UL>_>::Move(MI<45UL,_GF2::MOGrlex<45UL>_> *this,iterator pos)

{
  bool bVar1;
  iterator __val;
  _List_node_base *in_RSI;
  list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
  *in_RDI;
  size_t in_R9;
  iterator after;
  iterator where;
  _List_const_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> local_80;
  _List_const_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> local_78;
  _List_const_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> local_70;
  MP<45UL,_GF2::MOGrlex<45UL>_> *in_stack_ffffffffffffff98;
  _List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> in_stack_ffffffffffffffa0;
  _List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> __last;
  _List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> in_stack_ffffffffffffffa8;
  _List_const_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> local_50;
  _List_const_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> local_48;
  _List_const_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> local_40;
  _List_node_base *local_38;
  _List_node_base *local_30;
  _List_node_base *local_28;
  _List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> local_20 [2];
  _Self local_10;
  _List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> local_8;
  
  local_10._M_node = in_RSI;
  std::_List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::_List_iterator(&local_8);
  local_20[0]._M_node = local_10._M_node;
  local_30 = (_List_node_base *)
             std::__cxx11::
             list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
             ::begin(in_RDI);
  local_38 = local_10._M_node;
  std::_List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::operator*
            ((_List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> *)0x1dc2a3);
  local_28 = (_List_node_base *)
             std::
             lower_bound<std::_List_iterator<GF2::MP<45ul,GF2::MOGrlex<45ul>>>,GF2::MP<45ul,GF2::MOGrlex<45ul>>>
                       (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                        in_stack_ffffffffffffff98);
  local_8 = (_List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>)local_28;
  std::_List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::operator++(local_20);
  bVar1 = std::operator!=(&local_8,&local_10);
  if (bVar1) {
    std::_List_const_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::_List_const_iterator
              (&local_40,&local_8);
    std::_List_const_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::_List_const_iterator
              (&local_48,&local_10);
    std::_List_const_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::_List_const_iterator
              (&local_50,local_20);
    std::__cxx11::
    list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>::
    splice(in_RDI,(int)local_40._M_node,(__off64_t *)in_RDI,(int)local_48._M_node,
           (__off64_t *)local_50._M_node,in_R9,(uint)in_RDI);
  }
  else {
    __last._M_node = local_20[0]._M_node;
    __val = std::__cxx11::
            list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
            ::end(in_RDI);
    std::_List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::operator*
              ((_List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> *)0x1dc35b);
    local_8 = std::
              lower_bound<std::_List_iterator<GF2::MP<45ul,GF2::MOGrlex<45ul>>>,GF2::MP<45ul,GF2::MOGrlex<45ul>>>
                        (in_stack_ffffffffffffffa8,__last,__val._M_node);
    bVar1 = std::operator!=(&local_8,local_20);
    if (bVar1) {
      std::_List_const_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::_List_const_iterator
                (&local_70,&local_8);
      std::_List_const_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::_List_const_iterator
                (&local_78,&local_10);
      std::_List_const_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::_List_const_iterator
                (&local_80,local_20);
      std::__cxx11::
      list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
      ::splice(in_RDI,(int)local_70._M_node,(__off64_t *)in_RDI,(int)local_78._M_node,
               (__off64_t *)local_80._M_node,in_R9,(uint)in_RDI);
    }
    local_8._M_node = local_10._M_node;
  }
  return (iterator)local_8._M_node;
}

Assistant:

iterator Move(iterator pos)
	{
		assert(*pos != 0);
		iterator where, after = pos;
		where = std::lower_bound(begin(), pos, *pos), ++after;
		// перемещаем в младшую сторону?
		if (where != pos)
			splice(where, *this, pos, after);
		else
		{
			where = std::lower_bound(after, end(), *pos);
			// перемещаем в старшую сторону?
			if (where != after)
				splice(where, *this, pos, after);
			// не перемещаем
			where = pos;
		}
		return where;
	}